

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_indirect_sort(uint64_t *freq,uint64_t *syms,uint64_t *a,uint64_t n)

{
  uint64_t uVar1;
  int64_t iVar2;
  uint64_t *in_RCX;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  bool bVar3;
  uint64_t t_6;
  uint64_t *pj_6;
  uint64_t *pi_6;
  int64_t i_6;
  uint64_t t_5;
  uint64_t *pj_5;
  uint64_t *pi_5;
  int64_t i_5;
  uint64_t t_4;
  uint64_t *pj_4;
  uint64_t *pi_4;
  int64_t i_4;
  uint64_t t_3;
  uint64_t *pj_3;
  uint64_t *pi_3;
  int64_t i_3;
  uint64_t t_2;
  uint64_t *pj_2;
  uint64_t *pi_2;
  int64_t i_2;
  uint64_t t_1;
  uint64_t *pj_1;
  uint64_t *pi_1;
  int64_t i_1;
  uint64_t t;
  uint64_t *pj;
  uint64_t *pi;
  int64_t i;
  int64_t es;
  int64_t r;
  int64_t d;
  uint64_t *pn;
  uint64_t *pm;
  uint64_t *pl;
  uint64_t *pd;
  uint64_t *pc;
  uint64_t *pb;
  uint64_t *pa;
  long local_168;
  long local_160;
  undefined5 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  uint64_t *in_stack_fffffffffffffeb0;
  uint64_t *in_stack_fffffffffffffeb8;
  uint64_t *puVar4;
  uint64_t *in_stack_fffffffffffffec0;
  uint64_t *puVar5;
  long local_138;
  uint64_t *local_128;
  uint64_t *local_120;
  long local_118;
  uint64_t *local_108;
  uint64_t *local_100;
  long local_f8;
  uint64_t *local_e8;
  uint64_t *local_e0;
  long local_d8;
  uint64_t *local_c8;
  uint64_t *local_c0;
  long local_b8;
  uint64_t *local_a8;
  uint64_t *local_a0;
  long local_98;
  uint64_t *local_88;
  uint64_t *local_80;
  long local_78;
  long local_68;
  uint64_t *local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  uint64_t *local_30;
  uint64_t *n_00;
  
  if (in_RCX < (uint64_t *)0x7) {
    for (local_50 = in_RDX + 1; local_50 < in_RDX + (long)in_RCX; local_50 = local_50 + 1) {
      local_48 = local_50;
      while( true ) {
        bVar3 = false;
        if (in_RDX < local_48) {
          iVar2 = shuff_cmp(local_48 + -1,local_48,in_RDI);
          bVar3 = 0 < iVar2;
        }
        if (!bVar3) break;
        local_78 = 1;
        local_80 = local_48;
        local_88 = local_48 + -1;
        do {
          uVar1 = *local_80;
          *local_80 = *local_88;
          *local_88 = uVar1;
          local_78 = local_78 + -1;
          local_88 = local_88 + 1;
          local_80 = local_80 + 1;
        } while (0 < local_78);
        local_48 = local_48 + -1;
      }
    }
  }
  else {
    local_50 = in_RDX + ((ulong)in_RCX >> 1);
    if ((uint64_t *)0x7 < in_RCX) {
      if ((uint64_t *)0x28 < in_RCX) {
        shuff_med3(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   (uint64_t *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT15(in_stack_fffffffffffffead,in_stack_fffffffffffffea8)))
                  );
        shuff_med3(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   (uint64_t *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT15(in_stack_fffffffffffffead,in_stack_fffffffffffffea8)))
                  );
        shuff_med3(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   (uint64_t *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT15(in_stack_fffffffffffffead,in_stack_fffffffffffffea8)))
                  );
      }
      local_50 = shuff_med3(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb0,
                            (uint64_t *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,
                                              CONCAT15(in_stack_fffffffffffffead,
                                                       in_stack_fffffffffffffea8))));
    }
    local_98 = 1;
    local_a8 = local_50;
    local_a0 = in_RDX;
    do {
      uVar1 = *local_a0;
      *local_a0 = *local_a8;
      *local_a8 = uVar1;
      local_98 = local_98 + -1;
      local_a8 = local_a8 + 1;
      local_a0 = local_a0 + 1;
    } while (0 < local_98);
    local_30 = in_RDX + 1;
    local_38 = in_RDX + ((long)in_RCX - 1);
    n_00 = local_30;
    local_40 = local_38;
    while( true ) {
      while( true ) {
        bVar3 = false;
        if (local_30 <= local_38) {
          local_68 = shuff_cmp(local_30,in_RDX,in_RDI);
          bVar3 = local_68 < 1;
        }
        if (!bVar3) break;
        if (local_68 == 0) {
          local_b8 = 1;
          local_c8 = local_30;
          local_c0 = n_00;
          do {
            uVar1 = *local_c0;
            *local_c0 = *local_c8;
            *local_c8 = uVar1;
            local_b8 = local_b8 + -1;
            local_c8 = local_c8 + 1;
            local_c0 = local_c0 + 1;
          } while (0 < local_b8);
          n_00 = n_00 + 1;
        }
        local_30 = local_30 + 1;
      }
      while( true ) {
        bVar3 = false;
        if (local_30 <= local_38) {
          local_68 = shuff_cmp(local_38,in_RDX,in_RDI);
          bVar3 = -1 < local_68;
        }
        if (!bVar3) break;
        if (local_68 == 0) {
          local_d8 = 1;
          local_e0 = local_38;
          local_e8 = local_40;
          do {
            uVar1 = *local_e0;
            *local_e0 = *local_e8;
            *local_e8 = uVar1;
            local_d8 = local_d8 + -1;
            local_e8 = local_e8 + 1;
            local_e0 = local_e0 + 1;
          } while (0 < local_d8);
          local_40 = local_40 + -1;
        }
        local_38 = local_38 + -1;
      }
      if (local_38 < local_30) break;
      local_f8 = 1;
      local_100 = local_30;
      local_108 = local_38;
      do {
        uVar1 = *local_100;
        *local_100 = *local_108;
        *local_108 = uVar1;
        local_f8 = local_f8 + -1;
        local_108 = local_108 + 1;
        local_100 = local_100 + 1;
      } while (0 < local_f8);
      local_30 = local_30 + 1;
      local_38 = local_38 + -1;
    }
    if ((long)n_00 - (long)in_RDX >> 3 < (long)local_30 - (long)n_00 >> 3) {
      local_160 = (long)n_00 - (long)in_RDX;
    }
    else {
      local_160 = (long)local_30 - (long)n_00;
    }
    local_160 = local_160 >> 3;
    if (0 < local_160) {
      local_118 = local_160 / 1;
      local_128 = local_30 + -local_160;
      local_120 = in_RDX;
      do {
        uVar1 = *local_120;
        *local_120 = *local_128;
        *local_128 = uVar1;
        local_118 = local_118 + -1;
        local_128 = local_128 + 1;
        local_120 = local_120 + 1;
      } while (0 < local_118);
    }
    if ((long)local_40 - (long)local_38 >> 3 <
        ((long)in_RDX + ((long)in_RCX * 8 - (long)local_40) >> 3) + -1) {
      local_168 = (long)local_40 - (long)local_38 >> 3;
    }
    else {
      local_168 = ((long)in_RDX + ((long)in_RCX * 8 - (long)local_40) >> 3) + -1;
    }
    if (0 < local_168) {
      local_138 = local_168 / 1;
      puVar4 = in_RDX + ((long)in_RCX - local_168);
      puVar5 = local_30;
      do {
        uVar1 = *puVar5;
        *puVar5 = *puVar4;
        *puVar4 = uVar1;
        local_138 = local_138 + -1;
        puVar4 = puVar4 + 1;
        puVar5 = puVar5 + 1;
      } while (0 < local_138);
    }
    if (1 < (long)local_30 - (long)n_00 >> 3) {
      shuff_indirect_sort(in_RSI,in_RDX,in_RCX,(uint64_t)n_00);
    }
    if (1 < (long)local_40 - (long)local_38 >> 3) {
      shuff_indirect_sort(in_RSI,in_RDX,in_RCX,(uint64_t)n_00);
    }
  }
  return;
}

Assistant:

void shuff_indirect_sort(
    uint64_t* freq, uint64_t* syms, uint64_t* a, uint64_t n)
{
    uint64_t *pa, *pb, *pc, *pd, *pl, *pm, *pn;
    int64_t d, r;
    const int64_t es = 1;

    if (n < 7) {
        for (pm = a + es; pm < a + n * es; pm += es)
            for (pl = pm; pl > a && shuff_cmp(pl - es, pl, freq) > 0; pl -= es)
                shuff_swap(pl, pl - es);
        return;
    }
    pm = a + (n / 2) * es;
    if (n > 7) {
        pl = a;
        pn = a + (n - 1) * es;
        if (n > 40) {
            d = (n / 8) * es;
            pl = shuff_med3(pl, pl + d, pl + 2 * d, freq);
            pm = shuff_med3(pm - d, pm, pm + d, freq);
            pn = shuff_med3(pn - 2 * d, pn - d, pn, freq);
        }
        pm = shuff_med3(pl, pm, pn, freq);
    }
    shuff_swap(a, pm);
    pa = pb = a + es;

    pc = pd = a + (n - 1) * es;
    for (;;) {
        while (pb <= pc && (r = shuff_cmp(pb, a, freq)) <= 0) {
            if (r == 0) {
                shuff_swap(pa, pb);
                pa += es;
            }
            pb += es;
        }
        while (pb <= pc && (r = shuff_cmp(pc, a, freq)) >= 0) {
            if (r == 0) {
                shuff_swap(pc, pd);
                pd -= es;
            }
            pc -= es;
        }
        if (pb > pc)
            break;
        shuff_swap(pb, pc);
        pb += es;
        pc -= es;
    }
    pn = a + n * es;
    r = shuff_min(pa - a, pb - pa);
    vecshuff_swap(a, pb - r, r);
    r = shuff_min(pd - pc, pn - pd - es);
    vecshuff_swap(pb, pn - r, r);
    if ((r = pb - pa) > es)
        shuff_indirect_sort(freq, syms, a, r / es);
    if ((r = pd - pc) > es)
        shuff_indirect_sort(freq, syms, pn - r, r / es);
}